

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *rhs)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar1;
  Index IVar2;
  Index IVar3;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDX;
  Matrix<double,__1,__1,_0,__1,__1> *in_RSI;
  Scalar *in_stack_000000a8;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_000000b0;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_000000b8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_000000c0;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffffe0;
  
  pDVar1 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                     ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x16584d);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x16585c);
  this = pDVar1;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165876);
  if (((long)(pDVar1 + IVar3 + IVar2) < 0x14) &&
     (IVar2 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165891),
     0 < IVar2)) {
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,3>
    ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    return;
  }
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this);
  scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  return;
}

Assistant:

static void evalTo(Dst& dst, const Lhs& lhs, const Rhs& rhs)
  {
    if((rhs.rows()+dst.rows()+dst.cols())<20 && rhs.rows()>0)
      lazyproduct::evalTo(dst, lhs, rhs);
    else
    {
      dst.setZero();
      scaleAndAddTo(dst, lhs, rhs, Scalar(1));
    }
  }